

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O2

void __thiscall
http_request_method_parsing_invalid04_Test::TestBody
          (http_request_method_parsing_invalid04_Test *this)

{
  bool bVar1;
  AssertHelper AStack_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  sub_string str;
  
  str = sub_string::literal<7ul>((char (*) [7])"OPTION");
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    parse_request_method(&str);
  }
  testing::Message::Message((Message *)&local_20);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
             ,0x39,
             "Expected: parse_request_method(str) throws an exception of type http_parsing_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_28,(Message *)&local_20);
  testing::internal::AssertHelper::~AssertHelper(&AStack_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
  return;
}

Assistant:

TEST(http_request_method_parsing, invalid04)
{
    sub_string str = sub_string::literal("OPTION");
    EXPECT_THROW(parse_request_method(str), http_parsing_error);
}